

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexdumper.h
# Opt level: O0

int Hex::Hexdumper<char>::count_identical_lines(char *first,char *last,int unitsperline)

{
  bool bVar1;
  char **ppcVar2;
  undefined1 local_70 [8];
  pair<const_char_*,_const_char_*> thisline;
  char *local_58;
  char *pend_1;
  undefined1 auStack_48 [4];
  int count;
  pair<const_char_*,_const_char_*> firstline;
  char *local_30;
  char *pend;
  char *p;
  char *pcStack_18;
  int unitsperline_local;
  char *last_local;
  char *first_local;
  
  firstline.second = first + unitsperline;
  pend = first;
  p._4_4_ = unitsperline;
  pcStack_18 = last;
  last_local = first;
  ppcVar2 = std::min<char_const*>(&stack0xffffffffffffffe8,&firstline.second);
  local_30 = *ppcVar2;
  _auStack_48 = std::make_pair<char_const*&,char_const*&>(&pend,&local_30);
  pend_1._4_4_ = 1;
  pend = local_30;
  while( true ) {
    if (pcStack_18 <= pend) {
      return pend_1._4_4_;
    }
    thisline.second = pend + p._4_4_;
    ppcVar2 = std::min<char_const*>(&stack0xffffffffffffffe8,&thisline.second);
    local_58 = *ppcVar2;
    _local_70 = std::make_pair<char_const*&,char_const*&>(&pend,&local_58);
    bVar1 = data_is_equal<std::pair<char_const*,char_const*>>
                      ((pair<const_char_*,_const_char_*> *)auStack_48,
                       (pair<const_char_*,_const_char_*> *)local_70);
    if (!bVar1) break;
    pend_1._4_4_ = pend_1._4_4_ + 1;
    pend = local_58;
  }
  return pend_1._4_4_;
}

Assistant:

static int count_identical_lines(const T*first, const T*last, int unitsperline)
    {
        auto p = first;
        auto pend = std::min(last, p+unitsperline);
        auto firstline = std::make_pair(p, pend);

        int count = 1;

        p = pend;
        while (p<last) {
            auto pend = std::min(last, p+unitsperline);
            auto thisline = std::make_pair(p, pend);

            if (!data_is_equal(firstline, thisline))
                break;

            count++;

            p = pend;
        }

        return count;
    }